

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_array.h
# Opt level: O1

bool __thiscall re2::Compiler::IsCachedRuneByteSuffix(Compiler *this,int id)

{
  Inst *pIVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  pIVar1 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
           super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
  p_Var4 = (_Hash_node_base *)
           (((ulong)pIVar1[id].field_1.field_3.lo_ << 9 |
            (ulong)(pIVar1[id].out_opcode_ >> 4) << 0x11) +
            (ulong)pIVar1[id].field_1.field_3.hi_ * 2 |
           (ulong)(pIVar1[id].field_1.field_3.hint_foldcase_ & 1));
  uVar2 = (this->rune_cache_)._M_h._M_bucket_count;
  uVar5 = (ulong)p_Var4 % uVar2;
  p_Var6 = (this->rune_cache_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, p_Var4 != p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar5) ||
         (p_Var7 = p_Var6, p_Var4 == p_Var3[1]._M_nxt)) goto LAB_001b1a1a;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_001b1a1a:
  if (p_Var7 == (__node_base_ptr)0x0) {
    return false;
  }
  return p_Var7->_M_nxt != (_Hash_node_base *)0x0;
}

Assistant:

T& operator[](int pos) const {
    return ptr_[pos];
  }